

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

int Ivy_ManCleanup(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar3->pArray[lVar4];
      if (((pObj != (Ivy_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x8 & 0xc) == 4)) &&
         (pObj->nRefs == 0)) {
        Ivy_ObjDelete_rec(p,pObj,1);
      }
      lVar4 = lVar4 + 1;
      pVVar3 = p->vObjs;
    } while (lVar4 < pVVar3->nSize);
  }
  return (iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]);
}

Assistant:

int Ivy_ManCleanup( Ivy_Man_t * p )
{
    Ivy_Obj_t * pNode;
    int i, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pNode, i )
        if ( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
            if ( Ivy_ObjRefs(pNode) == 0 )
                Ivy_ObjDelete_rec( p, pNode, 1 );
//printf( "Cleanup removed %d nodes.\n", nNodesOld - Ivy_ManNodeNum(p) );
    return nNodesOld - Ivy_ManNodeNum(p);
}